

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubVerify.cpp
# Opt level: O0

void negation_verify::NegationVerifyT<signed_char>(void)

{
  char cVar1;
  ostream *poVar2;
  char out;
  bool result;
  char test;
  char minInt;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_ffffffffffffffd0;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *this
  ;
  char t;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_16;
  char local_15;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_6;
  char local_5;
  char local_4;
  byte local_3;
  char local_2;
  char local_1;
  
  local_1 = std::numeric_limits<signed_char>::min();
  local_2 = '\x02';
  local_3 = 0;
  local_4 = 0;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt(&local_6,&local_1);
  local_5 = (char)SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  ::operator-((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                               *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  local_4 = SafeInt::operator_cast_to_signed_char(in_stack_ffffffffffffffd0);
  if ((local_3 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error in NegationVerifyT throw (1): ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  this = &local_16;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt(this,&local_2);
  local_15 = (char)SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   ::operator-((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                                *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  cVar1 = SafeInt::operator_cast_to_signed_char(this);
  t = (char)((ulong)this >> 0x38);
  local_4 = cVar1;
  if ((local_3 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error in NegationVerifyT throw (2): ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  local_3 = SafeNegation<signed_char>(t,(char *)CONCAT17(cVar1,in_stack_ffffffffffffffc8));
  if ((bool)local_3) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error in NegationVerifyT nothrow (1): ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  local_3 = SafeNegation<signed_char>(t,(char *)CONCAT17(cVar1,in_stack_ffffffffffffffc8));
  if (!(bool)local_3) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error in NegationVerifyT nothrow (2): ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void NegationVerifyT()
    {
        T minInt = std::numeric_limits<T>::min();
        T test = 2;
        bool result = false;
        T out = 0;

        try
        {
            out = -SafeInt< T >(minInt);
        }
        catch (...)
        {
            result = true;
        }

        if (result == false)
            std::cerr << "Error in NegationVerifyT throw (1): " << std::endl;

        try
        {
            out = -SafeInt< T >(test);
        }
        catch (...)
        {
            result = false;
        }

        if (result == false)
            std::cerr << "Error in NegationVerifyT throw (2): " << std::endl;

        // Now try the non-throwing version

        result = SafeNegation(minInt, out);

        if (result != false)
            std::cerr << "Error in NegationVerifyT nothrow (1): " << std::endl;

        result = SafeNegation(test, out);

        if (result == false)
            std::cerr << "Error in NegationVerifyT nothrow (2): " << std::endl;
    }